

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O2

void __thiscall CEBody::CEBody(CEBody *this,CESkyCoord *coords,string *name)

{
  long lVar1;
  
  CESkyCoord::CESkyCoord(&this->super_CESkyCoord,coords);
  (this->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEBody_001406c8;
  std::__cxx11::string::string((string *)&this->name_);
  init_members(this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    SetName(this,name);
  }
  return;
}

Assistant:

CEBody::CEBody(const CESkyCoord&  coords, 
               const std::string& name) :
    CESkyCoord(coords)
{
    init_members();
    
    // Set the name if it is not empty
    if (name.size() > 0) SetName(name);
}